

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (Matches *__return_storage_ptr__,TestSpec *this,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,IConfig *config)

{
  pointer pTVar1;
  pointer ppTVar2;
  pointer ppTVar3;
  pointer this_00;
  bool bVar4;
  int iVar5;
  pointer this_01;
  TestCase *test;
  pointer testCase;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> currentMatches;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range2;
  void *local_a8;
  undefined8 uStack_a0;
  long local_98;
  pointer local_88;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_80;
  pointer local_78;
  string local_70;
  vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> local_50;
  pointer local_38;
  
  local_80 = testCases;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector(__return_storage_ptr__,
         ((long)(this->m_filters).
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_filters).
                super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
         (allocator_type *)&local_70);
  this_01 = (this->m_filters).
            super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_88 = (this->m_filters).
             super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != local_88) {
    local_78 = (__return_storage_ptr__->
               super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
               )._M_impl.super__Vector_impl_data._M_start;
    do {
      local_a8 = (void *)0x0;
      uStack_a0 = 0;
      local_98 = 0;
      pTVar1 = (local_80->super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      for (testCase = (local_80->
                      super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl
                      .super__Vector_impl_data._M_start; testCase != pTVar1; testCase = testCase + 1
          ) {
        if (((testCase->super_TestCaseInfo).properties & Throws) == None) {
LAB_00126a66:
          bVar4 = Filter::matches(this_01,&testCase->super_TestCaseInfo);
          if (bVar4) {
            local_38 = testCase;
            std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>::
            emplace_back<Catch::TestCase_const*>
                      ((vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>> *)
                       &local_a8,&local_38);
          }
        }
        else {
          iVar5 = (*(config->super_NonCopyable)._vptr_NonCopyable[2])(config);
          if ((char)iVar5 != '\0') goto LAB_00126a66;
        }
      }
      Filter::name_abi_cxx11_(&local_70,this_01);
      clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::vector
                (&local_50,
                 (vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> *)
                 &local_a8);
      this_00 = local_78;
      if (local_a8 != (void *)0x0) {
        operator_delete(local_a8,local_98 - (long)local_a8);
      }
      clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(&this_00->name,&local_70);
      ppTVar2 = (this_00->tests).
                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = (this_00->tests).
                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (this_00->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_50.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (this_00->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_50.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (this_00->tests).
      super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_50.
           super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_50.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (ppTVar2 != (pointer)0x0) {
        operator_delete(ppTVar2,(long)ppTVar3 - (long)ppTVar2);
        if (local_50.
            super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.
                          super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_50.
                                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_50.
                                super__Vector_base<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
      local_78 = this_00 + 1;
    } while (this_01 != local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCase> const& testCases, IConfig const& config ) const
    {
        Matches matches( m_filters.size() );
        std::transform( m_filters.begin(), m_filters.end(), matches.begin(), [&]( Filter const& filter ){
            std::vector<TestCase const*> currentMatches;
            for( auto const& test : testCases )
                if( isThrowSafe( test, config ) && filter.matches( test ) )
                    currentMatches.emplace_back( &test );
            return FilterMatch{ filter.name(), currentMatches };
        } );
        return matches;
    }